

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Property soul::heart::ProcessorProperty::getPropertyFromName(string *name)

{
  bool bVar1;
  string *name_local;
  
  bVar1 = std::operator==(name,"period");
  if (bVar1) {
    name_local._4_4_ = period;
  }
  else {
    bVar1 = std::operator==(name,"frequency");
    if (bVar1) {
      name_local._4_4_ = frequency;
    }
    else {
      bVar1 = std::operator==(name,"id");
      if (bVar1) {
        name_local._4_4_ = id;
      }
      else {
        bVar1 = std::operator==(name,"session");
        if (bVar1) {
          name_local._4_4_ = session;
        }
        else {
          bVar1 = std::operator==(name,"latency");
          if (bVar1) {
            name_local._4_4_ = latency;
          }
          else {
            name_local._4_4_ = none;
          }
        }
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

static Property getPropertyFromName (const std::string& name)
        {
            if (name == "period")     return Property::period;
            if (name == "frequency")  return Property::frequency;
            if (name == "id")         return Property::id;
            if (name == "session")    return Property::session;
            if (name == "latency")    return Property::latency;

            return Property::none;
        }